

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgatexture.cpp
# Opt level: O1

void __thiscall FTGATexture::MakeTexture(FTGATexture *this)

{
  ushort uVar1;
  WORD WVar2;
  byte bVar3;
  BYTE BVar4;
  int iVar5;
  BYTE *pBVar6;
  ushort *buffer;
  ushort *puVar7;
  byte *pbVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ushort *puVar12;
  uint uVar13;
  byte *pbVar14;
  char *pcVar15;
  long lVar16;
  BYTE a;
  BYTE b;
  BYTE g;
  BYTE r;
  WORD w;
  FWadLump lump;
  BYTE PaletteMap [256];
  BYTE aBStack_8138 [32689];
  byte local_187;
  byte local_186;
  byte local_185;
  ushort local_184;
  byte local_182;
  char local_181;
  byte local_180;
  short local_17f;
  short local_17d;
  byte local_17b;
  byte local_172;
  byte local_171;
  FWadLump local_170;
  BYTE local_138 [264];
  
  FWadCollection::OpenLumpNum(&local_170,&Wads,(this->super_FTexture).SourceLump);
  pBVar6 = (BYTE *)operator_new__((ulong)(this->super_FTexture).Height *
                                  (ulong)(this->super_FTexture).Width);
  this->Pixels = pBVar6;
  FWadLump::Read(&local_170,&local_182,0x12);
  FWadLump::Seek(&local_170,(ulong)local_182,1);
  if (local_181 != '\0') {
    memset(local_138,0,0x100);
    iVar5 = (int)local_17f;
    if ((iVar5 < 0x100) && (iVar5 < local_17d + iVar5)) {
      lVar16 = (long)iVar5;
      do {
        if (local_17b - 0xf < 2) {
          (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                    (&local_170,&local_184,2);
          local_185 = (char)local_184 * '\b';
          local_186 = (byte)(local_184 >> 2) & 0xf8;
          local_187 = (byte)(local_184 >> 7) & 0xf8;
LAB_0063ad0f:
          aBStack_8138[0x7fb0] = -1;
        }
        else {
          if (local_17b == 0x18) {
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb1,1);
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb2,1);
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb3,1);
            goto LAB_0063ad0f;
          }
          if (local_17b == 0x20) {
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb1,1);
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb2,1);
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb3,1);
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb0,1);
            if ((local_171 & 0xf) != 8) goto LAB_0063ad0f;
          }
          else {
            aBStack_8138[0x7fb0] = '\0';
            local_187 = 0;
            local_186 = 0;
            local_185 = 0;
          }
        }
        if ((char)aBStack_8138[0x7fb0] < '\0') {
          BVar4 = FColorMatcher::Pick(&ColorMatcher,(uint)local_185,(uint)local_186,(uint)local_187)
          ;
        }
        else {
          BVar4 = '\0';
        }
        local_138[lVar16] = BVar4;
      } while ((lVar16 < 0xff) && (lVar16 = lVar16 + 1, lVar16 < (long)local_17d + (long)local_17f))
      ;
    }
  }
  bVar3 = local_172 >> 3;
  uVar11 = (ulong)((uint)(this->super_FTexture).Height * (uint)(this->super_FTexture).Width *
                  (uint)bVar3);
  buffer = (ushort *)operator_new__(uVar11);
  if (local_180 < 4) {
    FWadLump::Read(&local_170,buffer,uVar11);
  }
  else {
    ReadCompressed(this,&local_170.super_FileReader,(BYTE *)buffer,(uint)bVar3);
  }
  uVar13 = (uint)local_172;
  bVar3 = local_172 >> 3;
  uVar11 = (ulong)(uint)bVar3;
  uVar10 = (this->super_FTexture).Width * uVar11;
  puVar7 = buffer;
  if ((local_171 & 0x20) == 0) {
    lVar16 = ((ulong)(this->super_FTexture).Height - 1) * uVar10;
    uVar10 = (ulong)(uint)-(int)uVar10;
    puVar7 = (ushort *)((long)buffer + lVar16);
  }
  local_180 = local_180 & 7;
  iVar5 = (int)uVar10;
  if (local_180 == 3) {
    if (local_172 == 8) {
      if ((this->super_FTexture).Height != 0) {
        uVar10 = 0;
        do {
          if ((this->super_FTexture).Width != 0) {
            puVar12 = (ushort *)(uVar10 * (long)iVar5 + (long)puVar7);
            uVar13 = 0;
            do {
              this->Pixels[(ulong)((this->super_FTexture).Height * uVar13) + (uVar10 & 0xffffffff)]
                   = FTexture::GrayMap[(byte)*puVar12];
              puVar12 = (ushort *)((long)puVar12 + uVar11);
              uVar13 = uVar13 + 1;
            } while (uVar13 < (this->super_FTexture).Width);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (this->super_FTexture).Height);
      }
    }
    else if ((uVar13 == 0x10) && ((this->super_FTexture).Height != 0)) {
      pbVar8 = (byte *)((long)puVar7 + 1);
      uVar10 = 0;
      do {
        if ((this->super_FTexture).Width != 0) {
          uVar13 = 0;
          pbVar14 = pbVar8;
          do {
            this->Pixels[(ulong)((this->super_FTexture).Height * uVar13) + (uVar10 & 0xffffffff)] =
                 FTexture::GrayMap[*pbVar14];
            uVar13 = uVar13 + 1;
            pbVar14 = pbVar14 + uVar11;
          } while (uVar13 < (this->super_FTexture).Width);
        }
        uVar10 = uVar10 + 1;
        pbVar8 = pbVar8 + iVar5;
      } while (uVar10 < (this->super_FTexture).Height);
    }
  }
  else if (local_180 == 2) {
    if (uVar13 - 0xf < 2) {
      if ((this->super_FTexture).Height != 0) {
        uVar11 = 0;
        do {
          if ((this->super_FTexture).Width != 0) {
            uVar13 = 0;
            puVar12 = puVar7;
            do {
              uVar1 = *puVar12;
              this->Pixels[(ulong)((this->super_FTexture).Height * uVar13) + (uVar11 & 0xffffffff)]
                   = RGB32k.All
                     [(ulong)(uVar1 & 0x1f) + (ulong)(uVar1 & 0x3e0) + (ulong)(uVar1 & 0x7c00)];
              uVar13 = uVar13 + 1;
              puVar12 = (ushort *)((long)puVar12 + (ulong)(bVar3 & 0xfffffffe));
            } while (uVar13 < (this->super_FTexture).Width);
          }
          uVar11 = uVar11 + 1;
          puVar7 = (ushort *)((long)puVar7 + (long)iVar5);
        } while (uVar11 < (this->super_FTexture).Height);
      }
    }
    else if (uVar13 == 0x20) {
      WVar2 = (this->super_FTexture).Height;
      if ((local_171 & 0xf) == 8) {
        if (WVar2 != 0) {
          pcVar9 = (char *)((long)puVar7 + 3);
          uVar10 = 0;
          do {
            if ((this->super_FTexture).Width != 0) {
              uVar13 = 0;
              pcVar15 = pcVar9;
              do {
                if (*pcVar15 < '\0') {
                  BVar4 = RGB32k.All
                          [(ulong)((byte)pcVar15[-3] >> 3) +
                           (ulong)((byte)pcVar15[-2] & 0xfffffff8) * 4 +
                           (ulong)(((byte)pcVar15[-1] & 0xf8) << 7)];
                }
                else {
                  BVar4 = '\0';
                }
                this->Pixels
                [(ulong)((this->super_FTexture).Height * uVar13) + (uVar10 & 0xffffffff)] = BVar4;
                uVar13 = uVar13 + 1;
                pcVar15 = pcVar15 + uVar11;
              } while (uVar13 < (this->super_FTexture).Width);
            }
            uVar10 = uVar10 + 1;
            pcVar9 = pcVar9 + iVar5;
          } while (uVar10 < (this->super_FTexture).Height);
        }
      }
      else if (WVar2 != 0) {
        puVar7 = puVar7 + 1;
        uVar10 = 0;
        do {
          if ((this->super_FTexture).Width != 0) {
            uVar13 = 0;
            puVar12 = puVar7;
            do {
              this->Pixels[(ulong)((this->super_FTexture).Height * uVar13) + (uVar10 & 0xffffffff)]
                   = RGB32k.All
                     [(ulong)(byte)((byte)puVar12[-1] >> 3) +
                      (ulong)(*(byte *)((long)puVar12 + -1) & 0xfffffff8) * 4 +
                      (ulong)(((byte)*puVar12 & 0xf8) << 7)];
              uVar13 = uVar13 + 1;
              puVar12 = (ushort *)((long)puVar12 + uVar11);
            } while (uVar13 < (this->super_FTexture).Width);
          }
          uVar10 = uVar10 + 1;
          puVar7 = (ushort *)((long)puVar7 + (long)iVar5);
        } while (uVar10 < (this->super_FTexture).Height);
      }
    }
    else if ((uVar13 == 0x18) && ((this->super_FTexture).Height != 0)) {
      puVar7 = puVar7 + 1;
      uVar11 = 0;
      do {
        if ((this->super_FTexture).Width != 0) {
          uVar13 = 0;
          puVar12 = puVar7;
          do {
            this->Pixels[(ulong)((this->super_FTexture).Height * uVar13) + (uVar11 & 0xffffffff)] =
                 RGB32k.All
                 [(ulong)(byte)((byte)puVar12[-1] >> 3) +
                  (ulong)(*(byte *)((long)puVar12 + -1) & 0xfffffff8) * 4 +
                  (ulong)(((byte)*puVar12 & 0xf8) << 7)];
            uVar13 = uVar13 + 1;
            puVar12 = (ushort *)((long)puVar12 + (ulong)bVar3);
          } while (uVar13 < (this->super_FTexture).Width);
        }
        uVar11 = uVar11 + 1;
        puVar7 = (ushort *)((long)puVar7 + (long)iVar5);
      } while (uVar11 < (this->super_FTexture).Height);
    }
  }
  else if ((local_180 == 1) && ((this->super_FTexture).Height != 0)) {
    uVar10 = 0;
    do {
      if ((this->super_FTexture).Width != 0) {
        puVar12 = (ushort *)(uVar10 * (long)iVar5 + (long)puVar7);
        uVar13 = 0;
        do {
          this->Pixels[(ulong)((this->super_FTexture).Height * uVar13) + (uVar10 & 0xffffffff)] =
               local_138[(byte)*puVar12];
          puVar12 = (ushort *)((long)puVar12 + uVar11);
          uVar13 = uVar13 + 1;
        } while (uVar13 < (this->super_FTexture).Width);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (this->super_FTexture).Height);
  }
  operator_delete__(buffer);
  FWadLump::~FWadLump(&local_170);
  return;
}

Assistant:

void FTGATexture::MakeTexture ()
{
	BYTE PaletteMap[256];
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	TGAHeader hdr;
	WORD w;
	BYTE r,g,b,a;
	BYTE * buffer;

	Pixels = new BYTE[Width*Height];
	lump.Read(&hdr, sizeof(hdr));
	lump.Seek(hdr.id_len, SEEK_CUR);
	
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);
	hdr.cm_first = LittleShort(hdr.cm_first);
	hdr.cm_length = LittleShort(hdr.cm_length);

	if (hdr.has_cm)
	{
		memset(PaletteMap, 0, 256);
		for (int i = hdr.cm_first; i < hdr.cm_first + hdr.cm_length && i < 256; i++)
		{
			switch (hdr.cm_size)
			{
			case 15:
			case 16:
				lump >> w;
				r = (w & 0x001F) << 3;
				g = (w & 0x03E0) >> 2;
				b = (w & 0x7C00) >> 7;
				a = 255;
				break;
				
			case 24:
				lump >> b >> g >> r;
				a=255;
				break;
				
			case 32:
				lump >> b >> g >> r >> a;
				if ((hdr.img_desc&15)!=8) a=255;
				break;
				
			default:	// should never happen
				r=g=b=a=0;
				break;
			}
			PaletteMap[i] = a>=128? ColorMatcher.Pick(r, g, b) : 0;
		}
    }
    
    int Size = Width * Height * (hdr.bpp>>3);
   	buffer = new BYTE[Size];
   	
    if (hdr.img_type < 4)	// uncompressed
    {
    	lump.Read(buffer, Size);
    }
    else				// compressed
    {
    	ReadCompressed(lump, buffer, hdr.bpp>>3);
    }
    
	BYTE * ptr = buffer;
	int step_x = (hdr.bpp>>3);
	int Pitch = Width * step_x;

	/*
	if (hdr.img_desc&32)
	{
		ptr += (Width-1) * step_x;
		step_x =- step_x;
	}
	*/
	if (!(hdr.img_desc&32))
	{
		ptr += (Height-1) * Pitch;
		Pitch = -Pitch;
	}

    switch (hdr.img_type & 7)
    {
	case 1:	// paletted
		for(int y=0;y<Height;y++)
		{
			BYTE * p = ptr + y * Pitch;
			for(int x=0;x<Width;x++)
			{
				Pixels[x*Height+y] = PaletteMap[*p];
				p+=step_x;
			}
		}
		break;

	case 2:	// RGB
		switch (hdr.bpp)
		{
		case 15:
		case 16:
			step_x>>=1;
			for(int y=0;y<Height;y++)
			{
				WORD * p = (WORD*)(ptr + y * Pitch);
				for(int x=0;x<Width;x++)
				{
					int v = LittleLong(*p);
					Pixels[x*Height+y] = RGB32k.RGB[(v>>10) & 0x1f][(v>>5) & 0x1f][v & 0x1f];
					p+=step_x;
				}
			}
			break;
		
		case 24:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3];
					p+=step_x;
				}
			}
			break;
		
		case 32:
			if ((hdr.img_desc&15)!=8)	// 32 bits without a valid alpha channel
			{
				for(int y=0;y<Height;y++)
				{
					BYTE * p = ptr + y * Pitch;
					for(int x=0;x<Width;x++)
					{
						Pixels[x*Height+y] = RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3];
						p+=step_x;
					}
				}
			}
			else
			{
				for(int y=0;y<Height;y++)
				{
					BYTE * p = ptr + y * Pitch;
					for(int x=0;x<Width;x++)
					{
						Pixels[x*Height+y] = p[3] >= 128? RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3] : 0;
						p+=step_x;
					}
				}
			}
			break;
		
		default:
			break;
		}
		break;
	
	case 3:	// Grayscale
		switch (hdr.bpp)
		{
		case 8:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = GrayMap[*p];
					p+=step_x;
				}
			}
			break;
		
		case 16:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = GrayMap[p[1]];	// only use the high byte
					p+=step_x;
				}
			}
			break;
		
		default:
			break;
		}
		break;

	default:
		break;
    }
	delete [] buffer;
}